

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derDec4(octet *der,size_t count,u32 tag,void *val,size_t len)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  u32 t;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar2 = derTLDec(&local_3c,&local_38,der,count);
  if (sVar2 == 0xffffffffffffffff) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    uVar4 = local_38 + sVar2;
    sVar3 = 0xffffffffffffffff;
    if (count < uVar4) {
      uVar4 = 0xffffffffffffffff;
    }
    if ((local_38 == len && local_3c == tag) && uVar4 != 0xffffffffffffffff) {
      bVar1 = memEq(der + sVar2,val,len);
      sVar3 = -(ulong)(bVar1 == 0) | uVar4;
    }
  }
  return sVar3;
}

Assistant:

size_t derDec4(const octet der[], size_t count, u32 tag, const void* val,
	size_t len)
{
	u32 t;
	const octet* v;
	size_t l;
	ASSERT(memIsValid(val, len));
	count = derDec(&t, &v, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len || !memEq(v, val, len))
		return SIZE_MAX;
	return count;
}